

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ExceptionTranslatorRegistry::~ExceptionTranslatorRegistry(ExceptionTranslatorRegistry *this)

{
  (this->super_IExceptionTranslatorRegistry)._vptr_IExceptionTranslatorRegistry =
       (_func_int **)&PTR__ExceptionTranslatorRegistry_00181568;
  deleteAll<std::vector<Catch::IExceptionTranslator_const*,std::allocator<Catch::IExceptionTranslator_const*>>>
            (&this->m_translators);
  std::
  _Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
  ::~_Vector_base(&(this->m_translators).
                   super__Vector_base<const_Catch::IExceptionTranslator_*,_std::allocator<const_Catch::IExceptionTranslator_*>_>
                 );
  return;
}

Assistant:

~ExceptionTranslatorRegistry() {
            deleteAll( m_translators );
        }